

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O0

apx_error_t serializer_pack_scalar_value(apx_vm_serializer_t *self)

{
  apx_error_t aVar1;
  int local_1c;
  apx_error_t retval;
  apx_vm_serializer_t *self_local;
  
  local_1c = 0;
  if (self == (apx_vm_serializer_t *)0x0) {
    __assert_fail("self != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                  ,0x5e1,"apx_error_t serializer_pack_scalar_value(apx_vm_serializer_t *)");
  }
  if (self->state->value_type == DTL_DV_SCALAR) {
    if ((self->state->value).sv == (dtl_sv_t *)0x0) {
      __assert_fail("self->state->value.sv != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x5e8,"apx_error_t serializer_pack_scalar_value(apx_vm_serializer_t *)");
    }
    if (self->state->range_check_state == '\0') {
      local_1c = state_default_range_check_value(self->state);
    }
    else if (self->state->range_check_state == '\x02') {
      local_1c = 0x44;
    }
    if (local_1c == 0) {
      aVar1 = serializer_pack_scalar_value_internal(self);
      return aVar1;
    }
  }
  else {
    local_1c = 0x43;
  }
  return local_1c;
}

Assistant:

static apx_error_t serializer_pack_scalar_value(apx_vm_serializer_t* self)
{
   apx_error_t retval = APX_NO_ERROR;
   assert(self != NULL);
   if (self->state->value_type != DTL_DV_SCALAR)
   {
      retval = APX_VALUE_TYPE_ERROR;
   }
   else
   {
      assert(self->state->value.sv != NULL);
      if (self->state->range_check_state == APX_RANGE_CHECK_STATE_NOT_CHECKED)
      {
         retval = state_default_range_check_value(self->state);
      }
      else if (self->state->range_check_state == APX_RANGE_CHECK_STATE_FAIL)
      {
         retval = APX_VALUE_RANGE_ERROR;
      }
      if (retval == APX_NO_ERROR)
      {
         return serializer_pack_scalar_value_internal(self);
      }
   }
   return retval;
}